

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

TestObject * __thiscall kj::Arena::allocate<kj::(anonymous_namespace)::TestObject>(Arena *this)

{
  int iVar1;
  TestObject *ptr;
  Fault f;
  DebugComparison<int_&,_int_&> _kjCondition;
  Fault local_40;
  DebugComparison<int_&,_int_&> local_38;
  
  ptr = (TestObject *)allocateBytes(this,4,4,true);
  iVar1 = (anonymous_namespace)::TestObject::count;
  ptr->index = (anonymous_namespace)::TestObject::count;
  local_38.right = &(anonymous_namespace)::TestObject::throwAt;
  local_38.op.content.ptr = " != ";
  local_38.result = iVar1 != (anonymous_namespace)::TestObject::throwAt;
  local_38.op.content.size_ = 5;
  local_38.left = (int *)ptr;
  if (local_38.result) {
    (anonymous_namespace)::TestObject::count = iVar1 + 1;
    setDestructor(this,ptr,destroyObject<kj::(anonymous_namespace)::TestObject>);
    return ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
             ,0x21,FAILED,"index != throwAt","_kjCondition,",&local_38);
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}